

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
::consume_operation::commit(consume_operation *this)

{
  void *pvVar1;
  
  if (this->m_control == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x3a9);
  }
  complete_type(this);
  pvVar1 = element_ptr(this);
  __clang_call_terminate(pvVar1);
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());

                auto const & type    = complete_type();
                auto const   element = element_ptr();
                type.destroy(element);

                type.RUNTIME_TYPE::~RUNTIME_TYPE();

                m_queue->commit_consume_impl(m_control);
                m_control = nullptr;
            }